

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

transformation_t *
opengv::relative_pose::seventeenpt
          (transformation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double *pdVar1;
  void *__dest;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  PVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  Index IVar60;
  undefined8 uVar61;
  transformation_t *ptVar62;
  int iVar63;
  long lVar64;
  double *pdVar65;
  undefined8 *puVar66;
  Index *pIVar67;
  int iVar68;
  ActualDstType actualDst;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  size_t sVar73;
  long lVar74;
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  double dVar88;
  undefined1 (*pauVar89) [16];
  Packet2d mask_3;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar105;
  undefined1 auVar104 [16];
  undefined1 extraout_var [56];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  Packet2d mask;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  double dVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar201 [16];
  undefined1 in_XMM19 [16];
  size_t numberCorrespondences;
  MatrixXd PI;
  MatrixXd SigmaInverse;
  rotation_t Rb;
  rotation_t Ra;
  VectorXd sigma;
  VectorXd b_trb;
  VectorXd b_tra;
  Vector3d tb;
  Vector3d ta;
  MatrixXd B;
  Index size;
  MatrixXd SigmaInverse_;
  VectorXd fitb;
  VectorXd fita;
  MatrixXd A_trb;
  MatrixXd A_tra;
  MatrixXd AR;
  MatrixXd AE;
  transformation_t *transformation;
  VectorXd sigma_;
  MatrixXd ARP;
  MatrixXd E_temp;
  Matrix<double,_9,_1,_0,_9,_1> e;
  MatrixXd C;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDa;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDb;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDE;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDR;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDARP;
  Matrix3d W;
  size_t local_ed8;
  scalar_sum_op<double,_double> local_ec9;
  DenseStorage<double,__1,__1,__1,_0> local_ec8;
  DenseStorage<double,__1,__1,__1,_0> local_ea8;
  undefined1 (*local_e88 [2]) [16];
  undefined1 local_e78 [56];
  double dStack_e40;
  double local_e38 [2];
  Matrix<double,_3,_3,_0,_3,_3> local_e28;
  DenseStorage<double,__1,__1,_1,_0> local_dd8;
  undefined1 local_dc8 [16];
  undefined1 local_db8 [16];
  blas_data_mapper<const_double,_long,_1,_0,_1> local_da8;
  double local_d98;
  ResScalar local_d88;
  double dStack_d80;
  double adStack_d78 [2];
  double *local_d68;
  double dStack_d60;
  double adStack_d58 [2];
  DenseStorage<double,__1,__1,__1,_0> local_d48;
  ulong local_d30;
  undefined1 local_d28 [24];
  Matrix<double,__1,__1,_0,__1,__1> local_d10;
  DenseStorage<double,__1,__1,__1,_0> local_cf8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_cd8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_cc8;
  DenseStorage<double,__1,__1,__1,_0> local_cb8;
  DenseStorage<double,__1,__1,__1,_0> local_c98;
  DenseStorage<double,__1,__1,__1,_0> local_c78;
  DenseStorage<double,__1,__1,__1,_0> local_c58;
  undefined1 (*local_c38) [16];
  transformation_t *local_c30;
  DenseStorage<double,__1,__1,_1,_0> local_c28;
  DenseStorage<double,__1,__1,__1,_0> local_c18;
  DenseStorage<double,__1,__1,__1,_0> local_bf8;
  double local_bd8 [4];
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  double dStack_ba0;
  double local_b98;
  long local_b88;
  MatrixType local_b80;
  undefined1 local_b68 [24];
  Matrix<double,__1,__1,_0,__1,__1> local_b50;
  DenseStorage<double,__1,__1,_1,_0> local_b38;
  double local_b28;
  undefined1 local_940 [64];
  undefined8 local_900;
  undefined1 local_8f8 [24];
  Matrix<double,__1,__1,_0,__1,__1> local_8e0;
  double *local_8c8;
  ulong uStack_8c0;
  double local_8b8;
  undefined1 local_6d8 [544];
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_4b8;
  undefined1 local_298 [24];
  Matrix<double,__1,__1,_0,__1,__1> local_280;
  DenseStorage<double,__1,__1,_1,_0> local_268;
  double local_258;
  undefined1 local_78 [64];
  undefined8 local_38;
  
  local_ed8 = indices->_numberCorrespondences;
  local_c58.m_data = (double *)0x0;
  local_c58.m_rows = 0;
  local_c58.m_cols = 0;
  local_c30 = __return_storage_ptr__;
  if (0xe38e38e38e38e38 < (long)local_ed8) {
    puVar66 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar66 = acos;
    __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c58,local_ed8 * 9,local_ed8,9);
  local_c78.m_data = (double *)0x0;
  local_c78.m_rows = 0;
  local_c78.m_cols = 0;
  if (0xe38e38e38e38e38 < (long)local_ed8) {
    puVar66 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar66 = acos;
    __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c78,local_ed8 * 9,local_ed8,9);
  auVar75 = in_ZMM14._0_16_;
  if (local_ed8 != 0) {
    lVar74 = 0;
    uVar69 = 0;
    do {
      iVar68 = (int)uVar69;
      lVar64 = lVar74 >> 0x1e;
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_4b8,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(local_b68,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(local_8f8,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(local_bd8,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(local_298,adapter,(long)iVar63);
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(local_6d8,adapter,(long)iVar68);
      auVar75 = in_ZMM14._0_16_;
      auVar78._0_8_ =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_298._0_8_;
      auVar78._8_8_ =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_298._8_8_;
      auVar121._8_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      auVar121._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      auVar80 = vfmadd231pd_fma(auVar78,auVar121,
                                (undefined1  [16])
                                local_280.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage._0_16_);
      auVar136._8_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auVar136._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auVar78 = vfmadd231pd_fma(auVar80,auVar136,(undefined1  [16])local_268);
      local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
      m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)((double)local_4b8.
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                           .m_matrixU.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data * (double)local_298._16_8_ +
                  (double)local_4b8.
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                          .m_matrixU.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_rows *
                  (double)local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_cols +
                  (double)local_4b8.
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                          .m_matrixU.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols * local_258);
      auVar171._0_8_ = (double)local_b68._0_8_ * (double)local_6d8._0_8_;
      auVar171._8_8_ = (double)local_b68._0_8_ * (double)local_6d8._8_8_;
      auVar137._8_8_ = local_b68._8_8_;
      auVar137._0_8_ = local_b68._8_8_;
      auVar80._8_8_ = local_6d8._32_8_;
      auVar80._0_8_ = local_6d8._24_8_;
      auVar80 = vfmadd231pd_fma(auVar171,auVar137,auVar80);
      auVar145._8_8_ = local_b68._16_8_;
      auVar145._0_8_ = local_b68._16_8_;
      PVar40 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
                )vfmadd231pd_fma(auVar80,auVar145,local_6d8._48_16_);
      local_b68._16_8_ =
           (double)local_b68._0_8_ * (double)local_6d8._16_8_ +
           (double)local_b68._8_8_ * (double)local_6d8._40_8_ +
           (double)local_b68._16_8_ * (double)local_6d8._64_8_;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = local_8f8._0_8_;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = local_8f8._8_8_;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = local_8f8._16_8_;
      local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
      m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           auVar78._0_8_;
      auVar186._8_8_ = 0;
      auVar186._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
      local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
      m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           auVar78._8_8_;
      auVar189._8_8_ = 0;
      auVar189._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      auVar79._8_8_ = 0;
      auVar79._0_8_ =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auVar160._8_8_ = 0;
      auVar160._0_8_ =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * (double)local_8f8._16_8_;
      auVar76 = vfmsub231sd_fma(auVar160,auVar138,auVar79);
      auVar146._8_8_ = 0;
      auVar146._0_8_ =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols * (double)local_8f8._0_8_;
      auVar77 = vfmsub231sd_fma(auVar146,auVar186,auVar182);
      auVar139._8_8_ = 0;
      auVar139._0_8_ =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_8f8._8_8_;
      auVar79 = vfmsub231sd_fma(auVar139,auVar178,auVar189);
      auVar187._8_8_ = 0;
      auVar187._0_8_ = local_bd8[0];
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_bd8[1];
      auVar190._8_8_ = 0;
      auVar190._0_8_ = local_bd8[2];
      local_b68._0_8_ = PVar40.m_lhs;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = local_b68._0_8_;
      local_b68._8_8_ = PVar40.m_rhs.m_matrix;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = local_b68._8_8_;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_b68._16_8_;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = (double)local_b68._8_8_ * local_bd8[2];
      auVar90 = vfmsub231sd_fma(auVar200,auVar179,auVar122);
      auVar183._8_8_ = 0;
      auVar183._0_8_ = local_bd8[0] * (double)local_b68._16_8_;
      auVar121 = vfmsub231sd_fma(auVar183,auVar191,auVar190);
      auVar180._8_8_ = 0;
      auVar180._0_8_ = (double)local_b68._0_8_ * local_bd8[1];
      auVar136 = vfmsub231sd_fma(auVar180,auVar187,auVar198);
      local_c58.m_data[uVar69] =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_b68._0_8_;
      auVar80 = vshufpd_avx(auVar78,auVar78,1);
      dVar185 = auVar80._0_8_;
      local_c58.m_data[uVar69 + local_c58.m_rows] = dVar185 * (double)local_b68._0_8_;
      local_c58.m_data[uVar69 + local_c58.m_rows * 2] =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols * (double)local_b68._0_8_;
      auVar80 = vshufpd_avx((undefined1  [16])PVar40,(undefined1  [16])PVar40,1);
      dVar88 = auVar80._0_8_;
      local_c58.m_data[uVar69 + local_c58.m_rows * 3] =
           dVar88 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
      local_c58.m_data[uVar69 + local_c58.m_rows * 4] = dVar185 * dVar88;
      local_c58.m_data[uVar69 + local_c58.m_rows * 5] =
           dVar88 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
      local_c58.m_data[uVar69 + local_c58.m_rows * 6] =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_b68._16_8_;
      local_c58.m_data[uVar69 + local_c58.m_rows * 7] = dVar185 * (double)local_b68._16_8_;
      local_c58.m_data[uVar69 + local_c58.m_rows * 8] =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols * (double)local_b68._16_8_;
      dVar88 = auVar90._0_8_;
      auVar192._8_8_ = 0;
      auVar192._0_8_ =
           dVar88 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
      auVar90 = vfmadd231sd_fma(auVar192,(undefined1  [16])PVar40,auVar76);
      local_c78.m_data[uVar69] = auVar90._0_8_;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = dVar185 * dVar88;
      auVar90 = vfmadd231sd_fma(auVar193,(undefined1  [16])PVar40,auVar77);
      local_c78.m_data[uVar69 + local_c78.m_rows] = auVar90._0_8_;
      auVar194._8_8_ = 0;
      auVar194._0_8_ =
           dVar88 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
      auVar90 = vfmadd231sd_fma(auVar194,auVar79,(undefined1  [16])PVar40);
      local_c78.m_data[uVar69 + local_c78.m_rows * 2] = auVar90._0_8_;
      dVar88 = auVar121._0_8_;
      auVar172._8_8_ = 0;
      auVar172._0_8_ =
           dVar88 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
      auVar90 = vfmadd231sd_fma(auVar172,auVar80,auVar76);
      local_c78.m_data[uVar69 + local_c78.m_rows * 3] = auVar90._0_8_;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = dVar185 * dVar88;
      auVar90 = vfmadd231sd_fma(auVar173,auVar80,auVar77);
      local_c78.m_data[uVar69 + local_c78.m_rows * 4] = auVar90._0_8_;
      auVar174._8_8_ = 0;
      auVar174._0_8_ =
           dVar88 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
      auVar80 = vfmadd231sd_fma(auVar174,auVar79,auVar80);
      in_ZMM6 = ZEXT1664(auVar80);
      local_c78.m_data[uVar69 + local_c78.m_rows * 5] = auVar80._0_8_;
      dVar88 = auVar136._0_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * dVar88;
      auVar80 = vfmadd231sd_fma(auVar90,auVar122,auVar76);
      local_c78.m_data[uVar69 + local_c78.m_rows * 6] = auVar80._0_8_;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = dVar185 * dVar88;
      auVar80 = vfmadd231sd_fma(auVar76,auVar122,auVar77);
      local_c78.m_data[uVar69 + local_c78.m_rows * 7] = auVar80._0_8_;
      auVar77._8_8_ = 0;
      auVar77._0_8_ =
           (double)local_4b8.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols * dVar88;
      auVar80 = vfmadd231sd_fma(auVar77,auVar122,auVar79);
      local_c78.m_data[uVar69 + local_c78.m_rows * 8] = auVar80._0_8_;
      uVar69 = uVar69 + 1;
      lVar74 = lVar74 + 0x100000000;
      local_b68._0_16_ = (undefined1  [16])PVar40;
      local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
      m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
           auVar78;
    } while (uVar69 < local_ed8);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298,
             (MatrixType *)&local_c78,0x28);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_c28,&local_268);
  auVar75 = vcvtusi2sd_avx512f(auVar75,local_ed8);
  local_e88[0] = (undefined1 (*) [16])(auVar75._0_8_ * *local_c28.m_data);
  local_cf8.m_data = (double *)0x0;
  local_cf8.m_rows = 0;
  local_cf8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_cf8,0x51,9,9);
  if ((local_cf8.m_rows != 9) || (local_cf8.m_cols != 9)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_cf8,0x51,9,9);
  }
  IVar60 = local_cf8.m_rows;
  if (0 < local_cf8.m_cols * local_cf8.m_rows) {
    memset(local_cf8.m_data,0,local_cf8.m_cols * local_cf8.m_rows * 8);
  }
  lVar74 = 0;
  pdVar65 = local_cf8.m_data;
  do {
    if ((double)local_e88[0] * 2.220446049250313e-16 < local_c28.m_data[lVar74]) {
      *pdVar65 = 1.0 / local_c28.m_data[lVar74];
    }
    lVar74 = lVar74 + 1;
    pdVar65 = pdVar65 + IVar60 + 1;
  } while (lVar74 != 9);
  local_c18.m_data = (double *)0x0;
  local_c18.m_rows = 0;
  local_c18.m_cols = 0;
  if ((local_ed8 != 0) &&
     (auVar75 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar75 / SEXT816((long)local_ed8),0) < 9)) {
    puVar66 = (undefined8 *)
              __cxa_allocate_exception(8,9,SUB168(auVar75 % SEXT816((long)local_ed8),0));
    *puVar66 = acos;
    __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c18,local_ed8 * 9,9,local_ed8);
  local_6d8._0_8_ = &local_280;
  local_6d8._8_8_ = &local_cf8;
  local_6d8._16_8_ = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_c18,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_6d8,(assign_op<double,_double> *)&local_4b8,(type)0x0);
  local_d48.m_data = (double *)0x0;
  local_d48.m_rows = 0;
  local_d48.m_cols = 0;
  if ((local_ed8 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_ed8),0) <
      (long)local_ed8)) {
    puVar66 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar66 = acos;
    __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_d48,local_ed8 * local_ed8,local_ed8,local_ed8);
  if ((local_d48.m_rows != local_ed8) || (local_d48.m_cols != local_ed8)) {
    if ((local_ed8 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_ed8),0) <
        (long)local_ed8)) {
      puVar66 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar66 = acos;
      __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_d48,local_ed8 * local_ed8,local_ed8,local_ed8);
  }
  if (0 < local_d48.m_cols) {
    auVar81 = vpbroadcastq_avx512f();
    sVar73 = 0;
    auVar82 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar83 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
    auVar84 = vpbroadcastq_avx512f(ZEXT816(8));
    pdVar65 = local_d48.m_data;
    do {
      if (0 < local_d48.m_rows) {
        auVar85 = vpbroadcastq_avx512f();
        uVar69 = 0;
        auVar86 = vmovdqa64_avx512f(auVar82);
        auVar177 = in_ZMM6;
        do {
          uVar71 = vpcmpuq_avx512f(auVar86,auVar81,2);
          uVar70 = vpcmpeqq_avx512f(auVar86,auVar85);
          auVar87._8_8_ = 0xbff0000000000000;
          auVar87._0_8_ = 0xbff0000000000000;
          auVar87._16_8_ = 0xbff0000000000000;
          auVar87._24_8_ = 0xbff0000000000000;
          auVar87._32_8_ = 0xbff0000000000000;
          auVar87._40_8_ = 0xbff0000000000000;
          auVar87._48_8_ = 0xbff0000000000000;
          auVar87._56_8_ = 0xbff0000000000000;
          auVar87 = vblendmpd_avx512f(auVar83,auVar87);
          bVar33 = (bool)((byte)uVar70 & 1);
          in_ZMM6._0_8_ = (ulong)bVar33 * auVar87._0_8_ | (ulong)!bVar33 * auVar177._0_8_;
          bVar33 = (bool)((byte)(uVar70 >> 1) & 1);
          in_ZMM6._8_8_ = (ulong)bVar33 * auVar87._8_8_ | (ulong)!bVar33 * auVar177._8_8_;
          bVar33 = (bool)((byte)(uVar70 >> 2) & 1);
          in_ZMM6._16_8_ = (ulong)bVar33 * auVar87._16_8_ | (ulong)!bVar33 * auVar177._16_8_;
          bVar33 = (bool)((byte)(uVar70 >> 3) & 1);
          in_ZMM6._24_8_ = (ulong)bVar33 * auVar87._24_8_ | (ulong)!bVar33 * auVar177._24_8_;
          bVar33 = (bool)((byte)(uVar70 >> 4) & 1);
          in_ZMM6._32_8_ = (ulong)bVar33 * auVar87._32_8_ | (ulong)!bVar33 * auVar177._32_8_;
          bVar33 = (bool)((byte)(uVar70 >> 5) & 1);
          in_ZMM6._40_8_ = (ulong)bVar33 * auVar87._40_8_ | (ulong)!bVar33 * auVar177._40_8_;
          bVar33 = (bool)((byte)(uVar70 >> 6) & 1);
          in_ZMM6._48_8_ = (ulong)bVar33 * auVar87._48_8_ | (ulong)!bVar33 * auVar177._48_8_;
          in_ZMM6._56_8_ =
               (uVar70 >> 7) * auVar87._56_8_ | (ulong)!SUB81(uVar70 >> 7,0) * auVar177._56_8_;
          pdVar1 = pdVar65 + uVar69;
          bVar33 = (bool)((byte)uVar71 & 1);
          bVar34 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar35 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar36 = (bool)((byte)(uVar71 >> 3) & 1);
          bVar37 = (bool)((byte)(uVar71 >> 4) & 1);
          bVar38 = (bool)((byte)(uVar71 >> 5) & 1);
          bVar39 = (bool)((byte)(uVar71 >> 6) & 1);
          *pdVar1 = (double)(bVar33 * in_ZMM6._0_8_ | (ulong)!bVar33 * (long)*pdVar1);
          pdVar1[1] = (double)(bVar34 * in_ZMM6._8_8_ | (ulong)!bVar34 * (long)pdVar1[1]);
          pdVar1[2] = (double)(bVar35 * in_ZMM6._16_8_ | (ulong)!bVar35 * (long)pdVar1[2]);
          pdVar1[3] = (double)(bVar36 * in_ZMM6._24_8_ | (ulong)!bVar36 * (long)pdVar1[3]);
          pdVar1[4] = (double)(bVar37 * in_ZMM6._32_8_ | (ulong)!bVar37 * (long)pdVar1[4]);
          pdVar1[5] = (double)(bVar38 * in_ZMM6._40_8_ | (ulong)!bVar38 * (long)pdVar1[5]);
          pdVar1[6] = (double)(bVar39 * in_ZMM6._48_8_ | (ulong)!bVar39 * (long)pdVar1[6]);
          pdVar1[7] = (double)((uVar71 >> 7) * in_ZMM6._56_8_ |
                              (ulong)!SUB81(uVar71 >> 7,0) * (long)pdVar1[7]);
          uVar69 = uVar69 + 8;
          auVar86 = vpaddq_avx512f(auVar86,auVar84);
          auVar177 = in_ZMM6;
        } while ((local_d48.m_rows + 7U & 0xfffffffffffffff8) != uVar69);
      }
      sVar73 = sVar73 + 1;
      pdVar65 = pdVar65 + local_d48.m_rows;
    } while (sVar73 != local_d48.m_cols);
  }
  local_6d8._0_8_ = &local_d48;
  local_6d8._8_8_ = &local_c78;
  local_6d8._16_8_ = &local_c18;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_d48,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_6d8,(assign_op<double,_double> *)&local_4b8,(type)0x0);
  local_6d8._8_8_ = &local_c58;
  local_6d8._0_8_ = &local_d48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b80,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_6d8);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_6d8,&local_b80,0x28);
  local_bd8[0] = *(double *)(local_6d8._24_8_ + local_6d8._32_8_ * 8 * 8);
  local_bd8[1] = ((double *)(local_6d8._24_8_ + local_6d8._32_8_ * 8 * 8))[1];
  local_bd8[2] = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 2) * 8);
  local_bd8[3] = ((double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 2) * 8))[1];
  local_bb8 = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 4) * 8);
  dStack_bb0 = ((double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 4) * 8))[1];
  local_ba8 = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 6) * 8);
  dStack_ba0 = ((double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 6) * 8))[1];
  local_b98 = *(double *)(local_6d8._24_8_ + (local_6d8._32_8_ * 8 + 8) * 8);
  local_bf8.m_data = (double *)0x0;
  local_bf8.m_rows = 0;
  local_bf8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_bf8,9,3,3);
  local_e88[0] = (undefined1 (*) [16])local_bf8.m_data;
  uVar69 = local_bf8.m_rows;
  if ((((ulong)local_bf8.m_data & 7) == 0) &&
     (uVar69 = (ulong)(-((uint)((ulong)local_bf8.m_data >> 3) & 0x1fffffff) & 7),
     local_bf8.m_rows <= (long)uVar69)) {
    uVar69 = local_bf8.m_rows;
  }
  local_d30 = local_bf8.m_rows;
  uVar71 = local_bf8.m_rows - uVar69;
  uVar70 = uVar71 + 7;
  if (-1 < (long)uVar71) {
    uVar70 = uVar71;
  }
  if (0 < (long)uVar69) {
    memcpy(local_bf8.m_data,local_bd8,uVar69 * 8);
  }
  lVar74 = (uVar70 & 0xfffffffffffffff8) + uVar69;
  if (7 < (long)uVar71) {
    lVar64 = uVar69 + 8;
    if ((long)(uVar69 + 8) < lVar74) {
      lVar64 = lVar74;
    }
    memcpy(*local_e88[0] + uVar69 * 8,local_bd8 + uVar69,
           (~uVar69 + lVar64 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  uVar71 = local_d30;
  if (lVar74 < (long)local_d30) {
    memcpy(local_e88[0][((long)uVar70 >> 3) * 4] + uVar69 * 8,
           local_bd8 + uVar69 + ((long)uVar70 >> 3) * 8,(local_d30 - lVar74) * 8);
  }
  __dest = *local_e88[0] + uVar71 * 8;
  uVar69 = uVar71;
  if ((((ulong)__dest & 7) == 0) &&
     (uVar69 = (ulong)(-((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7), (long)uVar71 <= (long)uVar69
     )) {
    uVar69 = uVar71;
  }
  uVar71 = uVar71 - uVar69;
  uVar70 = uVar71 + 7;
  if (-1 < (long)uVar71) {
    uVar70 = uVar71;
  }
  if (0 < (long)uVar69) {
    memcpy(__dest,local_bd8 + 3,uVar69 * 8);
  }
  uVar72 = local_d30;
  lVar74 = (uVar70 & 0xfffffffffffffff8) + uVar69;
  if (7 < (long)uVar71) {
    lVar64 = uVar69 + 8;
    if ((long)(uVar69 + 8) < lVar74) {
      lVar64 = lVar74;
    }
    memcpy(*local_e88[0] + (uVar69 + local_d30) * 8,local_bd8 + uVar69 + 3,
           (~uVar69 + lVar64 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar74 < (long)uVar72) {
    memcpy(local_e88[0][((long)uVar70 >> 3) * 4] + uVar72 * 8 + uVar69 * 8,
           local_bd8 + uVar69 + ((long)uVar70 >> 3) * 8 + 3,(uVar72 - lVar74) * 8);
  }
  local_b88 = uVar72 * 0x10;
  pauVar89 = local_e88[0] + uVar72;
  uVar69 = uVar72;
  if ((((ulong)pauVar89 & 7) == 0) &&
     (uVar69 = (ulong)(-((uint)((ulong)pauVar89 >> 3) & 0x1fffffff) & 7),
     (long)uVar72 <= (long)uVar69)) {
    uVar69 = uVar72;
  }
  uVar72 = uVar72 - uVar69;
  uVar70 = uVar72 + 7;
  if (-1 < (long)uVar72) {
    uVar70 = uVar72;
  }
  if (0 < (long)uVar69) {
    local_c38 = pauVar89;
    memcpy(pauVar89,local_bd8 + 6,uVar69 * 8);
    pauVar89 = local_c38;
  }
  lVar74 = (uVar70 & 0xfffffffffffffff8) + uVar69;
  if (7 < (long)uVar72) {
    lVar64 = uVar69 + 8;
    if ((long)(uVar69 + 8) < lVar74) {
      lVar64 = lVar74;
    }
    memcpy(*pauVar89 + uVar69 * 8,local_bd8 + uVar69 + 6,
           (~uVar69 + lVar64 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  uVar71 = local_d30;
  if (lVar74 < (long)local_d30) {
    memcpy(pauVar89[((long)uVar70 >> 3) * 4] + uVar69 * 8,
           local_bd8 + ((long)uVar70 >> 3) * 8 + uVar69 + 6,(local_d30 - lVar74) * 8);
  }
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)local_e88[0][1];
  auVar81 = vbroadcastsd_avx512f(auVar75);
  auVar81 = vpermi2pd_avx512f(_DAT_002598c0,ZEXT2464(CONCAT816(auVar81._16_8_,*local_e88[0])),
                              ZEXT1664(*(undefined1 (*) [16])(*local_e88[0] + uVar71 * 8)));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(local_e88[0][1] + uVar71 * 8);
  auVar82 = vbroadcastsd_avx512f(auVar2);
  auVar83._0_40_ = auVar81._0_40_;
  auVar83._40_8_ = auVar82._40_8_;
  auVar83._48_8_ = auVar81._48_8_;
  auVar83._56_8_ = auVar81._56_8_;
  local_940 = vpermi2pd_avx512f(_DAT_00259900,auVar83,
                                ZEXT1664(*(undefined1 (*) [16])(*local_e88[0] + local_b88)));
  local_900 = *(undefined8 *)(local_e88[0][1] + local_b88);
  local_b68._0_16_ = ZEXT816(0);
  local_b68._16_8_ = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_b68,9,3,3);
  if (((RhsNested)local_b68._8_8_ != (RhsNested)0x3) || (local_b68._16_8_ != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)local_b68,9,3,3);
  }
  uVar105 = local_b68._0_8_;
  uVar70 = local_b68._8_8_ * local_b68._16_8_;
  uVar69 = uVar70 + 7;
  if (-1 < (long)uVar70) {
    uVar69 = uVar70;
  }
  uVar71 = uVar69 & 0xfffffffffffffff8;
  if (7 < (long)uVar70) {
    uVar72 = 8;
    if (8 < (long)uVar71) {
      uVar72 = uVar71;
    }
    memcpy((void *)local_b68._0_8_,local_940,uVar72 * 8);
  }
  if ((long)uVar71 < (long)uVar70) {
    lVar74 = ((long)uVar69 >> 3) * 0x40;
    memcpy((double *)(uVar105 + lVar74),local_940 + lVar74,uVar70 * 8 + ((long)uVar69 >> 3) * -0x40)
    ;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_4b8,(MatrixType *)local_b68,0x14);
  if ((LhsNested)local_b68._0_8_ != (LhsNested)0x0) {
    free((void *)(((LhsNested)(local_b68._0_8_ + -0x18))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
    ;
  }
  local_78._0_24_ = SUB6424(ZEXT864(0),0) << 0x40;
  local_78._24_8_ = 0xbff0000000000000;
  auVar75 = local_78._16_16_;
  local_78._0_16_ = ZEXT816(0x3ff0000000000000) << 0x40;
  local_78 = ZEXT3264(CONCAT1616(auVar75,local_78._0_16_));
  local_38 = 0x3ff0000000000000;
  local_b68._16_8_ = (undefined1 *)((long)&local_4b8 + 0x18U);
  local_b68._0_8_ = &local_4b8;
  local_b68._8_8_ = (non_const_type)local_78;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_e28,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)local_b68,
             (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_b68 + 0x10));
  local_b68._8_8_ = (non_const_type)local_78;
  local_b68._0_8_ = &local_4b8;
  local_b68._16_8_ = (undefined1 *)((long)&local_4b8 + 0x18U);
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_e78,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
              *)local_b68,
             (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_b68 + 0x10));
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar75 = vfmsub231sd_fma(auVar147,auVar91,auVar106);
  auVar161._8_8_ = 0;
  auVar161._0_8_ =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar123._8_8_ = 0;
  auVar123._0_8_ =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar80 = vfmsub231sd_fma(auVar123,auVar161,auVar106);
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar78 = vfmsub231sd_fma(auVar92,auVar161,auVar140);
  if (auVar78._0_8_ *
      local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] + (auVar75._0_8_ *
             local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] -
            auVar80._0_8_ *
            local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3]) < 0.0) {
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = -local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7];
    auVar41._8_8_ = 0x8000000000000000;
    auVar41._0_8_ = 0x8000000000000000;
    auVar75 = vxorpd_avx512vl(auVar106,auVar41);
    local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = (double)vmovlpd_avx(auVar75);
  }
  dVar47 = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar46 = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
  dVar185 = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
  auVar124._8_8_ = 0;
  auVar124._0_8_ = local_e78._32_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_e38[0];
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_e78._40_8_;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = (double)local_e78._40_8_ * dStack_e40;
  auVar75 = vfmsub231sd_fma(auVar162,auVar124,auVar107);
  dVar88 = auVar75._0_8_ * (double)local_e78._0_8_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar88;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = local_e78._8_8_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = (double)local_e78._16_8_ * dStack_e40;
  auVar75 = vfmsub231sd_fma(auVar141,auVar175,auVar107);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = (double)local_e78._16_8_ * (double)local_e78._32_8_;
  auVar80 = vfmsub231sd_fma(auVar125,auVar175,auVar148);
  if (auVar80._0_8_ * (double)local_e78._48_8_ + (dVar88 - auVar75._0_8_ * (double)local_e78._24_8_)
      < 0.0) {
    local_e78._0_8_ = -(double)local_e78._0_8_;
    local_e78._8_8_ = -(double)local_e78._8_8_;
    local_e78._16_8_ = -(double)local_e78._16_8_;
    local_e78._24_8_ = -(double)local_e78._24_8_;
    local_e78._32_8_ = -(double)local_e78._32_8_;
    local_e78._40_8_ = -(double)local_e78._40_8_;
    local_e78._48_8_ = -(double)local_e78._48_8_;
    dStack_e40 = -dStack_e40;
    auVar42._8_8_ = 0x8000000000000000;
    auVar42._0_8_ = 0x8000000000000000;
    auVar75 = vxorpd_avx512vl(auVar107,auVar42);
    local_e38[0] = (double)vmovlpd_avx(auVar75);
  }
  uVar61 = local_e78._24_8_;
  uVar105 = local_e78._16_8_;
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       dVar185;
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       dVar46;
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       dVar47;
  local_e78._24_8_ = local_e78._8_8_;
  local_e78._8_8_ = uVar61;
  dVar88 = dStack_e40;
  local_e78._16_8_ = local_e78._48_8_;
  dStack_e40 = (double)local_e78._40_8_;
  local_e78._48_8_ = uVar105;
  local_e78._40_8_ = dVar88;
  local_c98.m_data = (double *)0x0;
  local_c98.m_rows = 0;
  local_c98.m_cols = 0;
  if (0x2aaaaaaaaaaaaaaa < (long)local_ed8) {
    puVar66 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar66 = acos;
    __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c98,local_ed8 * 3,local_ed8,3);
  local_cb8.m_data = (double *)0x0;
  local_cb8.m_rows = 0;
  local_cb8.m_cols = 0;
  if (0x2aaaaaaaaaaaaaaa < (long)local_ed8) {
    puVar66 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar66 = acos;
    __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_cb8,local_ed8 * 3,local_ed8,3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_db8,&local_ed8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_dc8,&local_ed8);
  if (local_ed8 != 0) {
    lVar74 = 0;
    local_e88[0] = (undefined1 (*) [16])0x8000000000000000;
    local_e88[1] = (undefined1 (*) [16])0x8000000000000000;
    uVar69 = 0;
    do {
      iVar68 = (int)uVar69;
      lVar64 = lVar74 >> 0x1e;
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_ea8,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(&local_ec8,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(&local_d68,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(&local_d88,adapter,(long)iVar63);
      iVar63 = iVar68;
      if (indices->_useIndices != false) {
        iVar63 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(local_b68,adapter,(long)iVar63);
      if (indices->_useIndices != false) {
        iVar68 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar64);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(local_8f8,adapter,(long)iVar68);
      auVar108._0_8_ = (double)local_ea8.m_data * (double)local_b68._0_8_;
      auVar108._8_8_ = (double)local_ea8.m_data * (double)local_b68._8_8_;
      auVar126._8_8_ = local_ea8.m_rows;
      auVar126._0_8_ = local_ea8.m_rows;
      auVar75 = vfmadd231pd_fma(auVar108,auVar126,
                                (undefined1  [16])
                                local_b50.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage._0_16_);
      auVar142._8_8_ = local_ea8.m_cols;
      auVar142._0_8_ = local_ea8.m_cols;
      auVar75 = vfmadd231pd_fma(auVar75,auVar142,(undefined1  [16])local_b38);
      local_ea8.m_cols =
           (Index)((double)local_ea8.m_data * (double)local_b68._16_8_ +
                  (double)local_ea8.m_rows *
                  (double)local_b50.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_cols + (double)local_ea8.m_cols * local_b28);
      local_ea8.m_data = auVar75._0_8_;
      local_ea8.m_rows = auVar75._8_8_;
      auVar127._0_8_ = (double)local_ec8.m_data * (double)local_8f8._0_8_;
      auVar127._8_8_ = (double)local_ec8.m_data * (double)local_8f8._8_8_;
      auVar143._8_8_ = local_ec8.m_rows;
      auVar143._0_8_ = local_ec8.m_rows;
      auVar75 = vfmadd231pd_fma(auVar127,auVar143,
                                (undefined1  [16])
                                local_8e0.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage._0_16_);
      auVar149._8_8_ = local_ec8.m_cols;
      auVar149._0_8_ = local_ec8.m_cols;
      auVar59._8_8_ = uStack_8c0;
      auVar59._0_8_ = local_8c8;
      auVar75 = vfmadd231pd_fma(auVar75,auVar149,auVar59);
      local_ec8.m_cols =
           (Index)((double)local_ec8.m_data * (double)local_8f8._16_8_ +
                  (double)local_ec8.m_rows *
                  (double)local_8e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_cols + (double)local_ec8.m_cols * local_8b8);
      local_ec8.m_data = auVar75._0_8_;
      local_ec8.m_rows = auVar75._8_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
      auVar150._8_8_ = 0;
      auVar150._0_8_ = (double)local_ea8.m_cols * (double)local_ec8.m_data;
      auVar163._8_8_ = 0;
      auVar163._0_8_ =
           (double)local_ea8.m_cols * (double)local_ec8.m_rows *
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar75 = vfmadd231sd_fma(auVar163,auVar150,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[7];
      auVar93._8_8_ = 0;
      auVar93._0_8_ = (double)local_ea8.m_cols * (double)local_ec8.m_cols;
      auVar75 = vfmadd132sd_fma(auVar93,auVar75,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[2];
      auVar128._8_8_ = 0;
      auVar128._0_8_ = (double)local_ec8.m_data * (double)local_ea8.m_rows;
      auVar75 = vfnmadd132sd_fma(auVar128,auVar75,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[5];
      auVar94._8_8_ = 0;
      auVar94._0_8_ = (double)local_ec8.m_rows * (double)local_ea8.m_rows;
      auVar75 = vfnmadd132sd_fma(auVar94,auVar75,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[8];
      auVar109._8_8_ = 0;
      auVar109._0_8_ = (double)local_ec8.m_cols * (double)local_ea8.m_rows;
      auVar75 = vfnmadd132sd_fma(auVar109,auVar75,auVar7);
      local_c98.m_data[uVar69] = auVar75._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[2];
      auVar151._8_8_ = 0;
      auVar151._0_8_ = (double)local_ea8.m_data * (double)local_ec8.m_data;
      auVar164._8_8_ = 0;
      auVar164._0_8_ =
           (double)local_ea8.m_data * (double)local_ec8.m_rows *
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar75 = vfmadd231sd_fma(auVar164,auVar151,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[8];
      auVar129._8_8_ = 0;
      auVar129._0_8_ = (double)local_ea8.m_data * (double)local_ec8.m_cols;
      auVar75 = vfmadd132sd_fma(auVar129,auVar75,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar95._8_8_ = 0;
      auVar95._0_8_ = (double)local_ec8.m_data * (double)local_ea8.m_cols;
      auVar75 = vfnmadd132sd_fma(auVar95,auVar75,auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar110._8_8_ = 0;
      auVar110._0_8_ = (double)local_ec8.m_rows * (double)local_ea8.m_cols;
      auVar75 = vfnmadd132sd_fma(auVar110,auVar75,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar96._8_8_ = 0;
      auVar96._0_8_ = (double)local_ec8.m_cols * (double)local_ea8.m_cols;
      auVar75 = vfnmadd132sd_fma(auVar96,auVar75,auVar12);
      local_c98.m_data[uVar69 + local_c98.m_rows] = auVar75._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar152._8_8_ = 0;
      auVar152._0_8_ = (double)local_ea8.m_rows * (double)local_ec8.m_data;
      auVar165._8_8_ = 0;
      auVar165._0_8_ =
           (double)local_ea8.m_rows * (double)local_ec8.m_rows *
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar75 = vfmadd231sd_fma(auVar165,auVar152,auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar111._8_8_ = 0;
      auVar111._0_8_ = (double)local_ea8.m_rows * (double)local_ec8.m_cols;
      auVar75 = vfmadd132sd_fma(auVar111,auVar75,auVar14);
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar130._8_8_ = 0;
      auVar130._0_8_ = (double)local_ec8.m_data * (double)local_ea8.m_data;
      auVar75 = vfnmadd132sd_fma(auVar130,auVar75,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar112._8_8_ = 0;
      auVar112._0_8_ = (double)local_ec8.m_rows * (double)local_ea8.m_data;
      auVar75 = vfnmadd132sd_fma(auVar112,auVar75,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar97._8_8_ = 0;
      auVar97._0_8_ = (double)local_ec8.m_cols * (double)local_ea8.m_data;
      auVar75 = vfnmadd132sd_fma(auVar97,auVar75,auVar17);
      local_c98.m_data[uVar69 + local_c98.m_rows * 2] = auVar75._0_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_e78._8_8_;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = (double)local_ea8.m_cols * (double)local_ec8.m_data;
      auVar166._8_8_ = 0;
      auVar166._0_8_ =
           (double)local_ea8.m_cols * (double)local_ec8.m_rows * (double)local_e78._32_8_;
      auVar75 = vfmadd231sd_fma(auVar166,auVar153,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dStack_e40;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = (double)local_ea8.m_cols * (double)local_ec8.m_cols;
      auVar75 = vfmadd132sd_fma(auVar113,auVar75,auVar19);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_e78._16_8_;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = (double)local_ec8.m_data * (double)local_ea8.m_rows;
      auVar75 = vfnmadd132sd_fma(auVar131,auVar75,auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_e78._40_8_;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = (double)local_ec8.m_rows * (double)local_ea8.m_rows;
      auVar75 = vfnmadd132sd_fma(auVar114,auVar75,auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_e38[0];
      auVar98._8_8_ = 0;
      auVar98._0_8_ = (double)local_ec8.m_cols * (double)local_ea8.m_rows;
      auVar75 = vfnmadd132sd_fma(auVar98,auVar75,auVar22);
      local_cb8.m_data[uVar69] = auVar75._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_e78._16_8_;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = (double)local_ea8.m_data * (double)local_ec8.m_data;
      auVar167._8_8_ = 0;
      auVar167._0_8_ =
           (double)local_ea8.m_data * (double)local_ec8.m_rows * (double)local_e78._40_8_;
      auVar75 = vfmadd231sd_fma(auVar167,auVar154,auVar23);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_e38[0];
      auVar132._8_8_ = 0;
      auVar132._0_8_ = (double)local_ea8.m_data * (double)local_ec8.m_cols;
      auVar75 = vfmadd132sd_fma(auVar132,auVar75,auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_e78._0_8_;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = (double)local_ec8.m_data * (double)local_ea8.m_cols;
      auVar75 = vfnmadd132sd_fma(auVar99,auVar75,auVar25);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_e78._24_8_;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = (double)local_ec8.m_rows * (double)local_ea8.m_cols;
      auVar75 = vfnmadd132sd_fma(auVar115,auVar75,auVar26);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_e78._48_8_;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = (double)local_ec8.m_cols * (double)local_ea8.m_cols;
      auVar75 = vfnmadd132sd_fma(auVar100,auVar75,auVar27);
      local_cb8.m_data[uVar69 + local_cb8.m_rows] = auVar75._0_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_e78._0_8_;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = (double)local_ea8.m_rows * (double)local_ec8.m_data;
      auVar168._8_8_ = 0;
      auVar168._0_8_ =
           (double)local_ea8.m_rows * (double)local_ec8.m_rows * (double)local_e78._24_8_;
      auVar75 = vfmadd231sd_fma(auVar168,auVar155,auVar28);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_e78._48_8_;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = (double)local_ea8.m_rows * (double)local_ec8.m_cols;
      auVar75 = vfmadd132sd_fma(auVar116,auVar75,auVar29);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_e78._8_8_;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = (double)local_ec8.m_data * (double)local_ea8.m_data;
      auVar75 = vfnmadd132sd_fma(auVar133,auVar75,auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_e78._32_8_;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = (double)local_ec8.m_rows * (double)local_ea8.m_data;
      auVar75 = vfnmadd132sd_fma(auVar117,auVar75,auVar31);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dStack_e40;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = (double)local_ec8.m_cols * (double)local_ea8.m_data;
      auVar75 = vfnmadd132sd_fma(auVar101,auVar75,auVar32);
      local_cb8.m_data[uVar69 + local_cb8.m_rows * 2] = auVar75._0_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = local_ea8.m_data;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_d68;
      auVar58._8_8_ = adStack_d58[0];
      auVar58._0_8_ = dStack_d60;
      auVar52._8_8_ = local_ea8.m_cols;
      auVar52._0_8_ = local_ea8.m_rows;
      auVar156._8_8_ = adStack_d58[0];
      auVar156._0_8_ = adStack_d58[0];
      auVar75 = vunpcklpd_avx(auVar156,auVar118);
      auVar157._0_8_ = (double)local_ea8.m_rows * auVar75._0_8_;
      auVar157._8_8_ = (double)local_ea8.m_cols * auVar75._8_8_;
      auVar169._8_8_ = local_ea8.m_cols;
      auVar169._0_8_ = local_ea8.m_cols;
      auVar75 = vunpcklpd_avx(auVar169,auVar102);
      local_da8 = (blas_data_mapper<const_double,_long,_1,_0,_1>)
                  vfmsub213pd_fma(auVar75,auVar58,auVar157);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = (double)local_ea8.m_data * dStack_d60;
      auVar75 = vfmsub231sd_fma(auVar103,auVar118,auVar52);
      local_d98 = auVar75._0_8_;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_d88;
      auVar134._8_8_ = local_ec8.m_data;
      auVar134._0_8_ = local_ec8.m_data;
      auVar55._8_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar55._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar56._8_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar56._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar181._8_8_ = 0;
      auVar181._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar184._8_8_ = 0;
      auVar184._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar57._8_8_ = adStack_d78[0];
      auVar57._0_8_ = dStack_d80;
      auVar51._8_8_ = local_ec8.m_cols;
      auVar51._0_8_ = local_ec8.m_rows;
      auVar195._8_8_ = adStack_d78[0];
      auVar195._0_8_ = adStack_d78[0];
      auVar75 = vunpcklpd_avx(auVar195,auVar119);
      auVar196._0_8_ = (double)local_ec8.m_rows * auVar75._0_8_;
      auVar196._8_8_ = (double)local_ec8.m_cols * auVar75._8_8_;
      auVar199._8_8_ = local_ec8.m_cols;
      auVar199._0_8_ = local_ec8.m_cols;
      auVar75 = vunpcklpd_avx(auVar199,auVar134);
      auVar90 = vfmsub213pd_fma(auVar75,auVar57,auVar196);
      auVar188._8_8_ = 0;
      auVar188._0_8_ = dStack_d80 * (double)local_ec8.m_data;
      auVar78 = vfmsub231sd_fma(auVar188,auVar51,auVar119);
      dVar185 = auVar90._0_8_;
      auVar197._0_8_ =
           dVar185 * local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0];
      auVar197._8_8_ =
           dVar185 * local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
      auVar75 = vshufpd_avx(auVar90,auVar90,3);
      auVar80 = vfmadd231pd_fma(auVar197,auVar55,auVar75);
      dVar88 = auVar78._0_8_;
      auVar201._8_8_ = dVar88;
      auVar201._0_8_ = dVar88;
      auVar80 = vfmadd231pd_fma(auVar80,auVar56,auVar201);
      auVar76 = vunpcklpd_avx512vl(auVar181,auVar184);
      auVar76 = vmulpd_avx512vl(auVar90,auVar76);
      auVar144._0_8_ =
           (double)local_ec8.m_data *
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar144._8_8_ =
           (double)local_ec8.m_data *
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar43._8_8_ = local_ec8.m_rows;
      auVar43._0_8_ = local_ec8.m_rows;
      auVar77 = vfmadd231pd_avx512vl(auVar144,auVar55,auVar43);
      auVar158._8_8_ = 0;
      auVar158._0_8_ =
           local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar78 = vmulsd_avx512f(auVar78,auVar158);
      auVar79 = vshufpd_avx512vl(auVar76,auVar76,1);
      auVar78 = vaddsd_avx512f(auVar79,auVar78);
      auVar78 = vaddsd_avx512f(auVar76,auVar78);
      vmovsd_avx512f(auVar78);
      auVar78 = vmulsd_avx512f(auVar169,auVar78);
      local_d28._8_8_ = &local_da8;
      local_d10.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
           vfmadd231pd_fma(auVar77,auVar199,auVar56);
      local_d10.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)((double)local_ec8.m_data *
                   local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2] +
                  (double)local_ec8.m_rows *
                  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[5] +
                  (double)local_ec8.m_cols *
                  local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8]);
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_db8._0_8_)->m_storage)
        .m_data)[uVar69] =
           (double *)
           ((double)((ulong)local_e88[0] ^
                    (ulong)(auVar80._0_8_ * (double)local_ea8.m_data +
                            auVar80._8_8_ * (double)local_ea8.m_rows + auVar78._0_8_)) -
           (local_d98 *
            (double)local_d10.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols +
           local_d10.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data * (double)local_da8.m_data +
           local_d10.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows * (double)local_da8.m_stride));
      auVar53._8_8_ = local_e78._8_8_;
      auVar53._0_8_ = local_e78._0_8_;
      auVar120._0_8_ = (double)local_e78._0_8_ * dVar185;
      auVar120._8_8_ = (double)local_e78._8_8_ * dVar185;
      auVar54._8_8_ = local_e78._32_8_;
      auVar54._0_8_ = local_e78._24_8_;
      auVar75 = vfmadd231pd_fma(auVar120,auVar54,auVar75);
      auVar78 = vfmadd231pd_fma(auVar75,stack0xfffffffffffff1b8,auVar201);
      auVar159._8_8_ = 0;
      auVar159._0_8_ = local_e78._16_8_;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = local_e78._40_8_;
      auVar75 = vshufpd_avx(auVar90,auVar90,1);
      auVar170._8_8_ = local_ec8.m_cols;
      auVar170._0_8_ = local_ec8.m_cols;
      auVar44._8_8_ = local_ec8.m_data;
      auVar44._0_8_ = local_ec8.m_data;
      auVar80 = vmulpd_avx512vl(auVar53,auVar44);
      auVar45._8_8_ = local_ec8.m_rows;
      auVar45._0_8_ = local_ec8.m_rows;
      auVar80 = vfmadd231pd_avx512vl(auVar80,auVar54,auVar45);
      auVar90 = vfmadd231pd_fma(auVar80,auVar170,stack0xfffffffffffff1b8);
      auVar80 = vunpcklpd_avx(auVar159,auVar176);
      auVar135._0_8_ = auVar80._0_8_ * (double)local_ec8.m_data;
      auVar135._8_8_ = auVar80._8_8_ * (double)local_ec8.m_rows;
      auVar80 = vshufpd_avx(auVar135,auVar135,1);
      *(double *)(local_dc8._0_8_ + uVar69 * 8) =
           (double)((ulong)local_e88[0] ^
                   (ulong)((dVar185 * (double)local_e78._16_8_ +
                           dVar88 * local_e38[0] + auVar75._0_8_ * (double)local_e78._40_8_) *
                           (double)local_ea8.m_cols +
                          auVar78._0_8_ * (double)local_ea8.m_data +
                          auVar78._8_8_ * (double)local_ea8.m_rows)) -
           ((auVar135._0_8_ + auVar80._0_8_ + local_e38[0] * (double)local_ec8.m_cols) * local_d98 +
           auVar90._0_8_ * (double)local_da8.m_data + auVar90._8_8_ * (double)local_da8.m_stride);
      uVar69 = uVar69 + 1;
      lVar74 = lVar74 + 0x100000000;
      local_d28._16_8_ = &local_d10;
    } while (uVar69 < local_ed8);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_b68,
             (MatrixType *)&local_c98,0x28);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_dd8,&local_b38);
  auVar75 = vcvtusi2sd_avx512f(in_XMM19,local_ed8);
  local_e88[0] = (undefined1 (*) [16])(auVar75._0_8_ * *local_dd8.m_data);
  local_ea8.m_data = (double *)0x0;
  local_ea8.m_rows = 0;
  local_ea8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ea8,9,3,3);
  if ((local_ea8.m_rows != 3) || (local_ea8.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ea8,9,3,3);
  }
  IVar60 = local_ea8.m_rows;
  if (0 < local_ea8.m_cols * local_ea8.m_rows) {
    memset(local_ea8.m_data,0,local_ea8.m_cols * local_ea8.m_rows * 8);
  }
  lVar74 = 0;
  pdVar65 = local_ea8.m_data;
  do {
    if ((double)local_e88[0] * 2.220446049250313e-16 < local_dd8.m_data[lVar74]) {
      *pdVar65 = 1.0 / local_dd8.m_data[lVar74];
    }
    lVar74 = lVar74 + 1;
    pdVar65 = pdVar65 + IVar60 + 1;
  } while (lVar74 != 3);
  local_ec8.m_data = (double *)0x0;
  local_ec8.m_rows = 0;
  local_ec8.m_cols = 0;
  if ((local_ed8 != 0) &&
     (auVar75 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar75 / SEXT816((long)local_ed8),0) < 3)) {
    puVar66 = (undefined8 *)
              __cxa_allocate_exception(8,3,SUB168(auVar75 % SEXT816((long)local_ed8),0));
    *puVar66 = acos;
    __cxa_throw(puVar66,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ec8,local_ed8 * 3,3,local_ed8);
  local_8f8._0_8_ = local_b68 + 0x18;
  local_8f8._8_8_ = &local_ea8;
  local_8f8._16_8_ = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_b68;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_ec8,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_8f8,(assign_op<double,_double> *)local_d28,(type)0x0);
  local_d68 = (double *)0x0;
  dStack_d60 = 0.0;
  adStack_d58[0] = 0.0;
  if ((DenseStorage<double,__1,__1,__1,_0> *)local_ec8.m_rows ==
      (DenseStorage<double,__1,__1,__1,_0> *)0x1) {
    if (local_db8._8_8_ == 0) {
      dVar88 = 0.0;
    }
    else {
      dVar88 = *local_ec8.m_data *
               (double)(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        local_db8._0_8_)->m_storage).m_data;
      if (1 < (long)local_db8._8_8_) {
        lVar74 = 1;
        pIVar67 = (Index *)local_ec8.m_data;
        do {
          pIVar67 = pIVar67 + 1;
          dVar88 = dVar88 + (double)*pIVar67 *
                            (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         *)local_db8._0_8_)->m_storage).m_data)[lVar74];
          lVar74 = lVar74 + 1;
        } while (local_db8._8_8_ != lVar74);
      }
    }
    local_d68 = (double *)(dVar88 + 0.0);
  }
  else {
    local_8f8._0_8_ = local_ec8.m_data;
    local_8f8._8_8_ = local_ec8.m_rows;
    local_d28._0_8_ = local_db8._0_8_;
    local_d28._8_8_ =
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)0x1;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(local_ec8.m_rows,local_ec8.m_cols,(const_blas_data_mapper<double,_long,_0> *)local_8f8,
          (const_blas_data_mapper<double,_long,_1> *)local_d28,(ResScalar *)&local_d68,1,1.0);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_8f8,
             (MatrixType *)&local_cb8,0x28);
  if (local_dd8.m_rows != uStack_8c0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_dd8,uStack_8c0,1);
  }
  uVar69 = local_dd8.m_rows + 7;
  if (-1 < local_dd8.m_rows) {
    uVar69 = local_dd8.m_rows;
  }
  uVar69 = uVar69 & 0xfffffffffffffff8;
  if (7 < local_dd8.m_rows) {
    lVar74 = 0;
    do {
      pdVar1 = local_8c8 + lVar74;
      dVar88 = pdVar1[1];
      dVar185 = pdVar1[2];
      dVar46 = pdVar1[3];
      dVar47 = pdVar1[4];
      dVar48 = pdVar1[5];
      dVar49 = pdVar1[6];
      dVar50 = pdVar1[7];
      pdVar65 = local_dd8.m_data + lVar74;
      *pdVar65 = *pdVar1;
      pdVar65[1] = dVar88;
      pdVar65[2] = dVar185;
      pdVar65[3] = dVar46;
      pdVar65[4] = dVar47;
      pdVar65[5] = dVar48;
      pdVar65[6] = dVar49;
      pdVar65[7] = dVar50;
      lVar74 = lVar74 + 8;
    } while (lVar74 < (long)uVar69);
  }
  if ((long)uVar69 < local_dd8.m_rows) {
    do {
      local_dd8.m_data[uVar69] = local_8c8[uVar69];
      uVar69 = uVar69 + 1;
    } while (local_dd8.m_rows != uVar69);
  }
  auVar75 = vcvtusi2sd_avx512f(auVar170,local_ed8);
  local_e88[0] = (undefined1 (*) [16])(auVar75._0_8_ * *local_dd8.m_data);
  if ((local_ea8.m_rows != 3) || (local_ea8.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ea8,9,3,3);
  }
  IVar60 = local_ea8.m_rows;
  if (0 < local_ea8.m_cols * local_ea8.m_rows) {
    memset(local_ea8.m_data,0,local_ea8.m_cols * local_ea8.m_rows * 8);
  }
  lVar74 = 0;
  pdVar65 = local_ea8.m_data;
  do {
    if ((double)local_e88[0] * 2.220446049250313e-16 < local_dd8.m_data[lVar74]) {
      *pdVar65 = 1.0 / local_dd8.m_data[lVar74];
    }
    lVar74 = lVar74 + 1;
    pdVar65 = pdVar65 + IVar60 + 1;
  } while (lVar74 != 3);
  local_d28._0_8_ = &local_8e0;
  local_d28._8_8_ = &local_ea8;
  local_d28._16_8_ = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_8f8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_ec8,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_d28,(assign_op<double,_double> *)&local_d88,(type)0x0);
  local_d88 = 0.0;
  dStack_d80 = 0.0;
  adStack_d78[0] = 0.0;
  if ((DenseStorage<double,__1,__1,__1,_0> *)local_ec8.m_rows ==
      (DenseStorage<double,__1,__1,__1,_0> *)0x1) {
    if (local_dc8._8_8_ == 0) {
      local_d88 = 0.0;
    }
    else {
      local_d88 = *local_ec8.m_data * *(double *)local_dc8._0_8_;
      if (1 < (long)local_dc8._8_8_) {
        lVar74 = 1;
        pIVar67 = (Index *)local_ec8.m_data;
        do {
          pIVar67 = pIVar67 + 1;
          local_d88 = local_d88 + (double)*pIVar67 * *(double *)(local_dc8._0_8_ + lVar74 * 8);
          lVar74 = lVar74 + 1;
        } while (local_dc8._8_8_ != lVar74);
      }
    }
    local_d88 = local_d88 + 0.0;
  }
  else {
    local_d28._0_8_ = local_ec8.m_data;
    local_d28._8_8_ = local_ec8.m_rows;
    local_da8.m_stride = 1;
    local_da8.m_data = (double *)local_dc8._0_8_;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(local_ec8.m_rows,local_ec8.m_cols,(const_blas_data_mapper<double,_long,_0> *)local_d28,
          (const_blas_data_mapper<double,_long,_1> *)&local_da8,&local_d88,1,1.0);
  }
  local_d28._8_8_ = &local_d68;
  local_cc8.m_storage.m_data = (double *)0x0;
  local_cc8.m_storage.m_rows = 0;
  local_d28._0_8_ = &local_c98;
  local_d28._16_8_ = (non_const_type)local_db8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_cc8,local_db8._8_8_,1);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_cc8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_d28,(assign_op<double,_double> *)&local_da8);
  local_d28._16_8_ = local_dc8;
  local_cd8.m_storage.m_data = (double *)0x0;
  local_cd8.m_storage.m_rows = 0;
  local_d28._0_8_ = &local_cb8;
  local_d28._8_8_ = &local_d88;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_cd8,local_dc8._8_8_,1);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_cd8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_d28,(assign_op<double,_double> *)&local_da8);
  uVar105 = 0;
  pauVar89 = (undefined1 (*) [16])0x0;
  if (local_cc8.m_storage.m_rows != 0) {
    local_d28._8_8_ = local_cc8.m_storage.m_data;
    local_da8.m_data = (double *)&local_cc8;
    pauVar89 = (undefined1 (*) [16])
               Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_d28,&local_ec9,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)&local_da8);
    uVar105 = extraout_XMM0_Qb;
  }
  auVar75 = SUB6416(ZEXT864(0),0) << 0x40;
  local_da8.m_data = (double *)&local_cd8;
  if (local_cd8.m_storage.m_rows != 0) {
    local_d28._8_8_ = local_cd8.m_storage.m_data;
    local_e88[0] = pauVar89;
    local_e88[1] = (undefined1 (*) [16])uVar105;
    auVar81._0_8_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
         ::
         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_d28,&local_ec9,
                    (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&local_da8);
    auVar81._8_56_ = extraout_var;
    auVar75 = auVar81._0_16_;
    pauVar89 = local_e88[0];
  }
  ptVar62 = local_c30;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = pauVar89;
  auVar80 = vsqrtpd_avx(auVar104);
  auVar75 = vsqrtsd_avx(auVar75,auVar75);
  lVar74 = 0x10;
  if (auVar75._0_8_ <= auVar80._0_8_) {
    do {
      uVar105 = *(undefined8 *)((long)local_e88 + lVar74 + 8);
      puVar66 = (undefined8 *)
                ((long)(local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                       m_storage.m_data.array + lVar74 + -0x10);
      *puVar66 = *(undefined8 *)((long)local_e88 + lVar74);
      puVar66[1] = uVar105;
      *(undefined8 *)
       ((long)(local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
              m_data.array + lVar74) = *(undefined8 *)(local_e78 + lVar74);
      lVar74 = lVar74 + 0x18;
    } while (lVar74 != 0x58);
    (local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array
    [9] = local_d88;
    (local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array
    [10] = dStack_d80;
    pdVar65 = adStack_d78;
  }
  else {
    do {
      uVar105 = *(undefined8 *)((long)local_e38 + lVar74 + 8);
      puVar66 = (undefined8 *)
                ((long)(local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                       m_storage.m_data.array + lVar74 + -0x10);
      *puVar66 = *(undefined8 *)((long)local_e38 + lVar74);
      puVar66[1] = uVar105;
      *(undefined8 *)
       ((long)(local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
              m_data.array + lVar74) =
           *(undefined8 *)
            ((long)local_e28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array + lVar74);
      lVar74 = lVar74 + 0x18;
    } while (lVar74 != 0x58);
    (local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array
    [9] = (double)local_d68;
    (local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array
    [10] = dStack_d60;
    pdVar65 = adStack_d58;
  }
  (local_c30->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.array
  [0xb] = *pdVar65;
  if ((assign_op<double,_double> *)local_cd8.m_storage.m_data != (assign_op<double,_double> *)0x0) {
    free(*(void **)((long)local_cd8.m_storage.m_data + -8));
  }
  if ((assign_op<double,_double> *)local_cc8.m_storage.m_data != (assign_op<double,_double> *)0x0) {
    free(*(void **)((long)local_cc8.m_storage.m_data + -8));
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_8f8);
  if ((LhsNested)local_ec8.m_data != (LhsNested)0x0) {
    free((void *)(((LhsNested)((long)local_ec8.m_data + -0x18))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
    ;
  }
  if (local_ea8.m_data != (double *)0x0) {
    free((void *)local_ea8.m_data[-1]);
  }
  if (local_dd8.m_data != (double *)0x0) {
    free((void *)local_dd8.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_b68);
  if ((double *)local_dc8._0_8_ != (double *)0x0) {
    free(*(void **)(local_dc8._0_8_ + -8));
  }
  if ((LhsNested)local_db8._0_8_ != (LhsNested)0x0) {
    free((void *)(((LhsNested)(local_db8._0_8_ + -0x18))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
    ;
  }
  if (local_cb8.m_data != (double *)0x0) {
    free((void *)local_cb8.m_data[-1]);
  }
  if (local_c98.m_data != (double *)0x0) {
    free((void *)local_c98.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_4b8);
  if ((undefined1 (*) [16])local_bf8.m_data != (undefined1 (*) [16])0x0) {
    free(*(void **)(*(undefined1 (*) [16])((long)local_bf8.m_data + -0x10) + 8));
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_6d8);
  if (local_b80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_b80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_d48.m_data != (double *)0x0) {
    free((void *)local_d48.m_data[-1]);
  }
  if (local_c18.m_data != (double *)0x0) {
    free((void *)local_c18.m_data[-1]);
  }
  if (local_cf8.m_data != (double *)0x0) {
    free((void *)local_cf8.m_data[-1]);
  }
  if (local_c28.m_data != (double *)0x0) {
    free((void *)local_c28.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298);
  if (local_c78.m_data != (double *)0x0) {
    free((void *)local_c78.m_data[-1]);
  }
  if (local_c58.m_data != (double *)0x0) {
    free((void *)local_c58.m_data[-1]);
  }
  return ptVar62;
}

Assistant:

transformation_t seventeenpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 16);

  Eigen::MatrixXd AE(numberCorrespondences,9);
  Eigen::MatrixXd AR(numberCorrespondences,9);

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    bearingVector_t d1 = adapter.getBearingVector1(indices[i]);
    bearingVector_t d2 = adapter.getBearingVector2(indices[i]);
    translation_t v1 = adapter.getCamOffset1(indices[i]);
    translation_t v2 = adapter.getCamOffset2(indices[i]);
    rotation_t R1 = adapter.getCamRotation1(indices[i]);
    rotation_t R2 = adapter.getCamRotation2(indices[i]);

    //unrotate the bearing-vectors to express everything in the body frame
    d1 = R1*d1;
    d2 = R2*d2;

    //generate the Plücker line coordinates
    Eigen::Matrix<double,6,1> l1;
    l1.block<3,1>(0,0) = d1;
    l1.block<3,1>(3,0) = v1.cross(d1);
    Eigen::Matrix<double,6,1> l2;
    l2.block<3,1>(0,0) = d2;
    l2.block<3,1>(3,0) = v2.cross(d2);

    //fill line of matrix A
    AE(i,0) = l2[0]*l1[0];
    AE(i,1) = l2[0]*l1[1];
    AE(i,2) = l2[0]*l1[2];
    AE(i,3) = l2[1]*l1[0];
    AE(i,4) = l2[1]*l1[1];
    AE(i,5) = l2[1]*l1[2];
    AE(i,6) = l2[2]*l1[0];
    AE(i,7) = l2[2]*l1[1];
    AE(i,8) = l2[2]*l1[2];

    AR(i,0) = l2[0]*l1[3]+l2[3]*l1[0];
    AR(i,1) = l2[0]*l1[4]+l2[3]*l1[1];
    AR(i,2) = l2[0]*l1[5]+l2[3]*l1[2];
    AR(i,3) = l2[1]*l1[3]+l2[4]*l1[0];
    AR(i,4) = l2[1]*l1[4]+l2[4]*l1[1];
    AR(i,5) = l2[1]*l1[5]+l2[4]*l1[2];
    AR(i,6) = l2[2]*l1[3]+l2[5]*l1[0];
    AR(i,7) = l2[2]*l1[4]+l2[5]*l1[1];
    AR(i,8) = l2[2]*l1[5]+l2[5]*l1[2];
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVDARP(
      AR,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  Eigen::VectorXd sigma_ = SVDARP.singularValues();
  double pinvtoler_ =
      sigma_(0)*numberCorrespondences*NumTraits<double>::epsilon();
  Eigen::MatrixXd SigmaInverse_(9,9);
  SigmaInverse_ = Eigen::MatrixXd::Zero(9,9);
  for ( size_t i=0; i < 9; ++i)
  {
    double temp = sigma_(i);
    if( temp > pinvtoler_ )
      SigmaInverse_(i,i) = 1.0/temp;
  }
  
  Eigen::MatrixXd ARP(9,numberCorrespondences);
  ARP = SVDARP.matrixV()*SigmaInverse_*SVDARP.matrixU().transpose();

  Eigen::MatrixXd B(numberCorrespondences,numberCorrespondences);
  B = -Eigen::MatrixXd::Identity(numberCorrespondences,numberCorrespondences);
  B = B + AR*ARP;

  Eigen::MatrixXd C = B*AE;
  
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDE(
      C,
      Eigen::ComputeThinU | Eigen::ComputeThinV );
  Eigen::Matrix<double,9,1> e = SVDE.matrixV().col(8);

  Eigen::MatrixXd E_temp(3,3);
  E_temp.col(0) = e.block<3,1>(0,0);
  E_temp.col(1) = e.block<3,1>(3,0);
  E_temp.col(2) = e.block<3,1>(6,0);
  essential_t E = E_temp.transpose();

  Eigen::JacobiSVD< Eigen::MatrixXd > SVDR(
      E,
      Eigen::ComputeFullV | Eigen::ComputeFullU );

  Eigen::Matrix3d W = Eigen::Matrix3d::Zero();
  W(0,1) = -1.0;
  W(1,0) = 1.0;
  W(2,2) = 1.0;

  // get possible rotation and translation vectors
  rotation_t Ra = SVDR.matrixU() * W * SVDR.matrixV().transpose();
  rotation_t Rb = SVDR.matrixU() * W.transpose() * SVDR.matrixV().transpose();

  // change sign if det = -1
  if( Ra.determinant() < 0 ) Ra = -Ra;
  if( Rb.determinant() < 0 ) Rb = -Rb;

  Ra.transposeInPlace();
  Rb.transposeInPlace();

  Eigen::MatrixXd A_tra(numberCorrespondences,3);
  Eigen::MatrixXd A_trb(numberCorrespondences,3);
  Eigen::VectorXd b_tra(numberCorrespondences);
  Eigen::VectorXd b_trb(numberCorrespondences);

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    bearingVector_t d1 = adapter.getBearingVector1(indices[i]);
    bearingVector_t d2 = adapter.getBearingVector2(indices[i]);
    translation_t v1 = adapter.getCamOffset1(indices[i]);
    translation_t v2 = adapter.getCamOffset2(indices[i]);
    rotation_t R1 = adapter.getCamRotation1(indices[i]);
    rotation_t R2 = adapter.getCamRotation2(indices[i]);

    //unrotate the bearing-vectors to express everything in the body frame
    d1 = R1*d1;
    d2 = R2*d2;

    A_tra(i,0) = d1[2]*d2[0]*Ra(1,0)+d1[2]*d2[1]*Ra(1,1)+d1[2]*d2[2]*Ra(1,2)
                -d1[1]*d2[0]*Ra(2,0)-d1[1]*d2[1]*Ra(2,1)-d1[1]*d2[2]*Ra(2,2);
    A_tra(i,1) = d1[0]*d2[0]*Ra(2,0)+d1[0]*d2[1]*Ra(2,1)+d1[0]*d2[2]*Ra(2,2)
                -d1[2]*d2[0]*Ra(0,0)-d1[2]*d2[1]*Ra(0,1)-d1[2]*d2[2]*Ra(0,2);
    A_tra(i,2) = d1[1]*d2[0]*Ra(0,0)+d1[1]*d2[1]*Ra(0,1)+d1[1]*d2[2]*Ra(0,2)
                -d1[0]*d2[0]*Ra(1,0)-d1[0]*d2[1]*Ra(1,1)-d1[0]*d2[2]*Ra(1,2);

    A_trb(i,0) = d1[2]*d2[0]*Rb(1,0)+d1[2]*d2[1]*Rb(1,1)+d1[2]*d2[2]*Rb(1,2)
                -d1[1]*d2[0]*Rb(2,0)-d1[1]*d2[1]*Rb(2,1)-d1[1]*d2[2]*Rb(2,2);
    A_trb(i,1) = d1[0]*d2[0]*Rb(2,0)+d1[0]*d2[1]*Rb(2,1)+d1[0]*d2[2]*Rb(2,2)
                -d1[2]*d2[0]*Rb(0,0)-d1[2]*d2[1]*Rb(0,1)-d1[2]*d2[2]*Rb(0,2);
    A_trb(i,2) = d1[1]*d2[0]*Rb(0,0)+d1[1]*d2[1]*Rb(0,1)+d1[1]*d2[2]*Rb(0,2)
                -d1[0]*d2[0]*Rb(1,0)-d1[0]*d2[1]*Rb(1,1)-d1[0]*d2[2]*Rb(1,2);

    Eigen::Vector3d temp1 = v1.cross(d1);
    Eigen::Vector3d temp2 = v2.cross(d2);
    b_tra(i) = -d1.dot(Ra*temp2) -temp1.dot(Ra*d2);
    b_trb(i) = -d1.dot(Rb*temp2) -temp1.dot(Rb*d2);
  }
  
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDa(
      A_tra,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  Eigen::VectorXd sigma = SVDa.singularValues();
  double pinvtoler =
      numberCorrespondences*sigma(0)*NumTraits<double>::epsilon();
  Eigen::MatrixXd SigmaInverse(3,3);
  SigmaInverse = Eigen::MatrixXd::Zero(3,3);
  for ( size_t i=0; i < 3; ++i)
  {
    double temp = sigma(i);
    if( temp > pinvtoler )
      SigmaInverse(i,i) = 1.0/temp;
  }

  Eigen::MatrixXd PI(3,numberCorrespondences);
  PI = SVDa.matrixV()*SigmaInverse*SVDa.matrixU().transpose();
  Eigen::Vector3d ta = PI*b_tra;

  Eigen::JacobiSVD< Eigen::MatrixXd > SVDb(
      A_trb,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  sigma = SVDb.singularValues();
  pinvtoler = numberCorrespondences*sigma(0)*NumTraits<double>::epsilon();
  SigmaInverse = Eigen::MatrixXd::Zero(3,3);
  for ( size_t i=0; i < 3; ++i)
  {
    double temp = sigma(i);
    if( temp > pinvtoler )
      SigmaInverse(i,i) = 1.0/temp;
  }

  PI = SVDb.matrixV()*SigmaInverse*SVDb.matrixU().transpose();
  Eigen::Vector3d tb = PI*b_trb;

  Eigen::VectorXd fita = A_tra * ta - b_tra;
  Eigen::VectorXd fitb = A_trb * tb - b_trb;

  transformation_t transformation;
  if( fita.norm() < fitb.norm() )
  {
    transformation.block<3,3>(0,0) = Ra;
    transformation.col(3) = ta;
  }
  else
  {
    transformation.block<3,3>(0,0) = Rb;
    transformation.col(3) = tb;
  }

  return transformation;
}